

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::LzmaEnc_InitPriceTables(UInt32 *ProbPrices)

{
  UInt32 i;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int j;
  int iVar5;
  
  for (uVar1 = 8; uVar1 < 0x800; uVar1 = uVar1 + 0x10) {
    iVar2 = 0;
    uVar4 = uVar1 & 0xffffffff;
    for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
      iVar2 = iVar2 * 2;
      for (uVar3 = (int)uVar4 * (int)uVar4; uVar4 = (ulong)uVar3, 0xffff < uVar3; uVar3 = uVar3 >> 1
          ) {
        iVar2 = iVar2 + 1;
      }
    }
    ProbPrices[uVar1 >> 4] = 0xa1 - iVar2;
  }
  return;
}

Assistant:

void LzmaEnc_InitPriceTables(UInt32* ProbPrices) {
  UInt32 i;
  for (i = (1 << kNumMoveReducingBits) / 2; i < kBitModelTotal; i += (1 << kNumMoveReducingBits)) {
    const int kCyclesBits = kNumBitPriceShiftBits;
    UInt32 w = i;
    UInt32 bitCount = 0;
    int j;
    for (j = 0; j < kCyclesBits; j++) {
      w = w * w;
      bitCount <<= 1;
      while (w >= ((UInt32)1 << 16)) {
        w >>= 1;
        bitCount++;
      }
    }
    ProbPrices[i >> kNumMoveReducingBits] = ((kNumBitModelTotalBits << kCyclesBits) - 15 - bitCount);
  }
}